

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O2

ON_ContentHash *
ON_ContentHash::CreateFromFile(ON_ContentHash *__return_storage_ptr__,char *filename)

{
  ON__UINT64 OVar1;
  ON__UINT64 OVar2;
  ON__UINT64 OVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ON_SHA1_Hash sha1_file_name_hash_00;
  ON_ContentHash *pOVar8;
  FILE *fp;
  ON_SHA1_Hash sha1_file_name_hash;
  ON_SHA1_Hash local_38;
  
  pOVar8 = Cache::FromFile(filename);
  if (pOVar8 == (ON_ContentHash *)0x0) {
    if (filename == (char *)0x0) {
      local_38.m_digest[0x10] = ON_SHA1_Hash::ZeroDigest.m_digest[0x10];
      local_38.m_digest[0x11] = ON_SHA1_Hash::ZeroDigest.m_digest[0x11];
      local_38.m_digest[0x12] = ON_SHA1_Hash::ZeroDigest.m_digest[0x12];
      local_38.m_digest[0x13] = ON_SHA1_Hash::ZeroDigest.m_digest[0x13];
      local_38.m_digest[0] = ON_SHA1_Hash::ZeroDigest.m_digest[0];
      local_38.m_digest[1] = ON_SHA1_Hash::ZeroDigest.m_digest[1];
      local_38.m_digest[2] = ON_SHA1_Hash::ZeroDigest.m_digest[2];
      local_38.m_digest[3] = ON_SHA1_Hash::ZeroDigest.m_digest[3];
      local_38.m_digest[4] = ON_SHA1_Hash::ZeroDigest.m_digest[4];
      local_38.m_digest[5] = ON_SHA1_Hash::ZeroDigest.m_digest[5];
      local_38.m_digest[6] = ON_SHA1_Hash::ZeroDigest.m_digest[6];
      local_38.m_digest[7] = ON_SHA1_Hash::ZeroDigest.m_digest[7];
      local_38.m_digest[8] = ON_SHA1_Hash::ZeroDigest.m_digest[8];
      local_38.m_digest[9] = ON_SHA1_Hash::ZeroDigest.m_digest[9];
      local_38.m_digest[10] = ON_SHA1_Hash::ZeroDigest.m_digest[10];
      local_38.m_digest[0xb] = ON_SHA1_Hash::ZeroDigest.m_digest[0xb];
      local_38.m_digest[0xc] = ON_SHA1_Hash::ZeroDigest.m_digest[0xc];
      local_38.m_digest[0xd] = ON_SHA1_Hash::ZeroDigest.m_digest[0xd];
      local_38.m_digest[0xe] = ON_SHA1_Hash::ZeroDigest.m_digest[0xe];
      local_38.m_digest[0xf] = ON_SHA1_Hash::ZeroDigest.m_digest[0xf];
    }
    else {
      ON_SHA1_Hash::FileSystemPathHash(&local_38,filename);
    }
    fp = ON_FileStream::Open(filename,"rb");
    sha1_file_name_hash_00.m_digest[8] = local_38.m_digest[8];
    sha1_file_name_hash_00.m_digest[9] = local_38.m_digest[9];
    sha1_file_name_hash_00.m_digest[10] = local_38.m_digest[10];
    sha1_file_name_hash_00.m_digest[0xb] = local_38.m_digest[0xb];
    sha1_file_name_hash_00.m_digest[0xc] = local_38.m_digest[0xc];
    sha1_file_name_hash_00.m_digest[0xd] = local_38.m_digest[0xd];
    sha1_file_name_hash_00.m_digest[0xe] = local_38.m_digest[0xe];
    sha1_file_name_hash_00.m_digest[0xf] = local_38.m_digest[0xf];
    sha1_file_name_hash_00.m_digest[0] = local_38.m_digest[0];
    sha1_file_name_hash_00.m_digest[1] = local_38.m_digest[1];
    sha1_file_name_hash_00.m_digest[2] = local_38.m_digest[2];
    sha1_file_name_hash_00.m_digest[3] = local_38.m_digest[3];
    sha1_file_name_hash_00.m_digest[4] = local_38.m_digest[4];
    sha1_file_name_hash_00.m_digest[5] = local_38.m_digest[5];
    sha1_file_name_hash_00.m_digest[6] = local_38.m_digest[6];
    sha1_file_name_hash_00.m_digest[7] = local_38.m_digest[7];
    sha1_file_name_hash_00.m_digest[0x10] = local_38.m_digest[0x10];
    sha1_file_name_hash_00.m_digest[0x11] = local_38.m_digest[0x11];
    sha1_file_name_hash_00.m_digest[0x12] = local_38.m_digest[0x12];
    sha1_file_name_hash_00.m_digest[0x13] = local_38.m_digest[0x13];
    CreateFromFile(__return_storage_ptr__,sha1_file_name_hash_00,fp);
    ON_FileStream::Close(fp);
    Cache::Add(filename,__return_storage_ptr__);
  }
  else {
    OVar1 = pOVar8->m_byte_count;
    OVar2 = pOVar8->m_hash_time;
    OVar3 = pOVar8->m_content_time;
    uVar4 = *(undefined8 *)(pOVar8->m_sha1_name_hash).m_digest;
    uVar5 = *(undefined8 *)((pOVar8->m_sha1_name_hash).m_digest + 8);
    uVar6 = *(undefined8 *)((pOVar8->m_sha1_name_hash).m_digest + 0x10);
    uVar7 = *(undefined8 *)((pOVar8->m_sha1_content_hash).m_digest + 0xc);
    *(undefined8 *)((__return_storage_ptr__->m_sha1_content_hash).m_digest + 4) =
         *(undefined8 *)((pOVar8->m_sha1_content_hash).m_digest + 4);
    *(undefined8 *)((__return_storage_ptr__->m_sha1_content_hash).m_digest + 0xc) = uVar7;
    *(undefined8 *)((__return_storage_ptr__->m_sha1_name_hash).m_digest + 8) = uVar5;
    *(undefined8 *)((__return_storage_ptr__->m_sha1_name_hash).m_digest + 0x10) = uVar6;
    __return_storage_ptr__->m_content_time = OVar3;
    *(undefined8 *)(__return_storage_ptr__->m_sha1_name_hash).m_digest = uVar4;
    __return_storage_ptr__->m_byte_count = OVar1;
    __return_storage_ptr__->m_hash_time = OVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

ON_ContentHash ON_ContentHash::CreateFromFile( 
  const char* filename
  )
{
  if (auto pHash = Cache::FromFile(filename))
  {
    return *pHash;
  }

  ON_SHA1_Hash sha1_file_name_hash = (nullptr == filename) ? ON_SHA1_Hash::ZeroDigest : ON_SHA1_Hash::FileSystemPathHash(filename);
  FILE* fp = ON_FileStream::Open(filename, "rb");
  ON_ContentHash hash = ON_ContentHash::CreateFromFile(sha1_file_name_hash,fp);
  ON_FileStream::Close(fp);

  Cache::Add(filename, hash);

  return hash;
}